

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * string_get_sortable_timestamp_abi_cxx11_(void)

{
  tm *__tp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char timestamp_ns [11];
  int64_t ns;
  char timestamp_no_ns [100];
  time_t as_time_t;
  time_point current_time;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  time_point *in_stack_fffffffffffffec0;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [33];
  char local_b7 [11];
  undefined4 local_ac;
  rep local_a8;
  rep local_a0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_98;
  rep local_90;
  char local_88 [112];
  time_t local_18;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_10 [2];
  
  __lhs = in_RDI;
  local_10[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18 = std::chrono::_V2::system_clock::to_time_t(in_stack_fffffffffffffec0);
  __tp = localtime(&local_18);
  strftime(local_88,100,"%Y_%m_%d-%H_%M_%S",__tp);
  local_a8 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(local_10);
  local_ac = 1000000000;
  local_a0 = (rep)std::chrono::operator%
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)__lhs,(int *)in_RDI);
  local_98.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_fffffffffffffe98);
  local_90 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_98);
  snprintf(local_b7,0xb,"%09ld",local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
             (allocator<char> *)in_stack_fffffffffffffed0);
  std::operator+(__lhs,(char *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
             (allocator<char> *)in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  return __lhs;
}

Assistant:

std::string string_get_sortable_timestamp() {
    using clock = std::chrono::system_clock;

    const clock::time_point current_time = clock::now();
    const time_t as_time_t = clock::to_time_t(current_time);
    char timestamp_no_ns[100];
    std::strftime(timestamp_no_ns, 100, "%Y_%m_%d-%H_%M_%S", std::localtime(&as_time_t));

    const int64_t ns = std::chrono::duration_cast<std::chrono::nanoseconds>(
        current_time.time_since_epoch() % 1000000000).count();
    char timestamp_ns[11];
    snprintf(timestamp_ns, 11, "%09" PRId64, ns);

    return std::string(timestamp_no_ns) + "." + std::string(timestamp_ns);
}